

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O0

void ptm_mgau_reset_fast_hist(ps_mgau_t *ps)

{
  char *pcVar1;
  _func_int_ps_mgau_t_ptr_int16_ptr_uint8_ptr_int32_mfcc_t_ptr_ptr_int32_int32 *p_Var2;
  int local_28;
  int local_24;
  int m;
  int k;
  int j;
  int i;
  ptm_mgau_t *s;
  ps_mgau_t *ps_local;
  
  for (k = 0; k < *(int *)&ps[6].vt; k = k + 1) {
    pcVar1 = (char *)__ckd_calloc_3d__((long)*(int *)(*(long *)&ps[1].frame_idx + 0x20),
                                       (long)*(int *)(*(long *)&ps[1].frame_idx + 0x24),
                                       (long)(short)ps[4].frame_idx,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                       ,0x30b);
    (&(ps[5].vt)->name)[(long)k * 2] = pcVar1;
    for (m = 0; m < *(int *)(*(long *)&ps[1].frame_idx + 0x20); m = m + 1) {
      for (local_24 = 0; local_24 < *(int *)(*(long *)&ps[1].frame_idx + 0x24);
          local_24 = local_24 + 1) {
        for (local_28 = 0; local_28 < (short)ps[4].frame_idx; local_28 = local_28 + 1) {
          *(int *)(*(long *)(*(long *)((&(ps[5].vt)->name)[(long)k * 2] + (long)m * 8) +
                            (long)local_24 * 8) + (long)local_28 * 8) = local_28;
          *(undefined4 *)
           (*(long *)(*(long *)((&(ps[5].vt)->name)[(long)k * 2] + (long)m * 8) + (long)local_24 * 8
                     ) + 4 + (long)local_28 * 8) = 0x80000000;
        }
      }
    }
    p_Var2 = (_func_int_ps_mgau_t_ptr_int16_ptr_uint8_ptr_int32_mfcc_t_ptr_ptr_int32_int32 *)
             __ckd_calloc__((long)((*(int *)(*(long *)&ps[1].frame_idx + 0x20) + 0x1f) / 0x20),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                            ,0x317);
    (&(ps[5].vt)->frame_eval)[(long)k * 2] = p_Var2;
    memset((&(ps[5].vt)->frame_eval)[(long)k * 2],0xff,
           (long)((*(int *)(*(long *)&ps[1].frame_idx + 0x20) + 0x1f) / 0x20) << 2);
  }
  return;
}

Assistant:

void
ptm_mgau_reset_fast_hist(ps_mgau_t *ps)
{
    ptm_mgau_t *s = (ptm_mgau_t *)ps;
    int i;

    for (i = 0; i < s->n_fast_hist; ++i) {
        int j, k, m;
        /* Top-N codewords for every codebook and feature. */
        s->hist[i].topn = ckd_calloc_3d(s->g->n_mgau, s->g->n_feat,
                                        s->max_topn, sizeof(ptm_topn_t));
        /* Initialize them to sane (yet arbitrary) defaults. */
        for (j = 0; j < s->g->n_mgau; ++j) {
            for (k = 0; k < s->g->n_feat; ++k) {
                for (m = 0; m < s->max_topn; ++m) {
                    s->hist[i].topn[j][k][m].cw = m;
                    s->hist[i].topn[j][k][m].score = WORST_DIST;
                }
            }
        }
        /* Active codebook mapping (just codebook, not features,
           at least not yet) */
        s->hist[i].mgau_active = bitvec_alloc(s->g->n_mgau);
        /* Start with them all on, prune them later. */
        bitvec_set_all(s->hist[i].mgau_active, s->g->n_mgau);
    }
}